

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O3

int Aig_TableCountEntries(Aig_Man_t *p)

{
  int iVar1;
  long lVar2;
  Aig_Obj_t *pAVar3;
  
  if (0 < (long)p->nTableSize) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      pAVar3 = (Aig_Obj_t *)(p->pTable + lVar2);
      iVar1 = iVar1 + -1;
      do {
        pAVar3 = (pAVar3->field_0).pNext;
        iVar1 = iVar1 + 1;
      } while (pAVar3 != (Aig_Obj_t *)0x0);
      lVar2 = lVar2 + 1;
    } while (lVar2 != p->nTableSize);
    return iVar1;
  }
  return 0;
}

Assistant:

int Aig_TableCountEntries( Aig_Man_t * p )
{
    Aig_Obj_t * pEntry;
    int i, Counter = 0;
    for ( i = 0; i < p->nTableSize; i++ )
        for ( pEntry = p->pTable[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
    return Counter;
}